

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes1.cc
# Opt level: O1

int __thiscall Node::IsSimpleInteger(Node *this)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  
  if (((1 < this->Type - 0x1cfU) ||
      (pcVar1 = (this->TextValue)._M_dataplus._M_p, 9 < (int)*pcVar1 - 0x30U)) ||
     (iVar2 = (int)pcVar1[(this->TextValue)._M_string_length - 1], iVar3 = 1,
     iVar2 - 0x3aU < 0xfffffff6 && iVar2 != 0x25)) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int Node::IsSimpleInteger(void)
{
	//
	// Base type must be integer
	//
	if ((Type == BAS_V_INTEGER) || (Type == BAS_V_INT))
	{
		//
		// Has to start with a digit
		//
		if (isdigit(TextValue[0]))
		{
			//
			// has to end with a digit or a '%'
			//
			char LastChar = *(TextValue.end() - 1);
			if (isdigit(LastChar) || (LastChar == '%'))
			{
				return 1;
			}
		}
	}

	return 0;
}